

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::internal::format_string_checker<char,fmt::v5::internal::error_handler>&,char>>
                 (char *begin,char *end,
                 id_adapter<fmt::v5::internal::format_string_checker<char,_fmt::v5::internal::error_handler>_&,_char>
                 *handler)

{
  byte bVar1;
  char cVar2;
  format_string_checker<char,_fmt::v5::internal::error_handler> *pfVar3;
  byte *pbVar4;
  byte *pbVar5;
  char *pcVar6;
  error_handler *this;
  uint uVar7;
  
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    pfVar3 = handler->handler;
    this = (error_handler *)&pfVar3->context_;
    uVar7 = (pfVar3->context_).next_arg_id_;
    if ((int)uVar7 < 0) {
      error_handler::on_error(this,"cannot switch from manual to automatic argument indexing");
      uVar7 = 0;
    }
    else {
      (pfVar3->context_).next_arg_id_ = uVar7 + 1;
    }
    pfVar3->arg_id_ = uVar7;
LAB_001d3990:
    pcVar6 = "argument index out of range";
  }
  else {
    if ((byte)(bVar1 - 0x30) < 10) {
      begin = begin + 1;
      uVar7 = 0;
      pcVar6 = begin;
      if (bVar1 != 0x30) {
        while (uVar7 < 0xccccccd) {
          uVar7 = ((int)pcVar6[-1] + uVar7 * 10) - 0x30;
          begin = end;
          if ((pcVar6 == end) ||
             (cVar2 = *pcVar6, begin = pcVar6, pcVar6 = pcVar6 + 1, 9 < (byte)(cVar2 - 0x30U)))
          goto LAB_001d39f7;
        }
        uVar7 = 0x80000000;
        begin = pcVar6 + -1;
LAB_001d39f7:
        if ((int)uVar7 < 0) {
          error_handler::on_error((error_handler *)&handler->handler->context_,"number is too big");
        }
      }
      if ((begin != end) && ((*begin == ':' || (*begin == '}')))) {
        pfVar3 = handler->handler;
        pfVar3->arg_id_ = uVar7;
        this = (error_handler *)&pfVar3->context_;
        if ((pfVar3->context_).next_arg_id_ < 1) {
          (pfVar3->context_).next_arg_id_ = -1;
        }
        else {
          error_handler::on_error(this,"cannot switch from automatic to manual argument indexing");
        }
        goto LAB_001d3990;
      }
    }
    else if ((bVar1 == 0x5f) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) {
      pbVar5 = (byte *)(begin + 1);
      do {
        pbVar4 = pbVar5;
        if (pbVar4 == (byte *)end) {
          return end;
        }
        bVar1 = *pbVar4;
        pbVar5 = pbVar4 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      return (char *)pbVar4;
    }
    this = (error_handler *)&handler->handler->context_;
    pcVar6 = "invalid format string";
  }
  error_handler::on_error(this,pcVar6);
  return begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}